

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegularExpression.cxx
# Opt level: O0

void cmsys::reginsert(char op,char *opnd)

{
  char *place;
  char *dst;
  char *src;
  char *opnd_local;
  char op_local;
  
  if (regcode == &regdummy) {
    regsize = regsize + 3;
  }
  else {
    dst = regcode;
    regcode = regcode + 3;
    place = regcode;
    while (opnd < dst) {
      place[-1] = dst[-1];
      place = place + -1;
      dst = dst + -1;
    }
    *opnd = op;
    opnd[1] = '\0';
    opnd[2] = '\0';
  }
  return;
}

Assistant:

static void reginsert(char op, char* opnd)
{
  char* src;
  char* dst;
  char* place;

  if (regcode == &regdummy) {
    regsize += 3;
    return;
  }

  src = regcode;
  regcode += 3;
  dst = regcode;
  while (src > opnd)
    *--dst = *--src;

  place = opnd; // Op node, where operand used to be.
  *place++ = op;
  *place++ = '\0';
  *place = '\0';
}